

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImVector<ImGuiContextHook> *this;
  ImGuiNavMoveResult *pIVar1;
  ImGuiNextWindowData *pIVar2;
  ImVec2 *pIVar3;
  float *pfVar4;
  float fVar5;
  double dVar6;
  int user_key_index;
  ImGuiContextHook *pIVar7;
  char *pcVar8;
  ImGuiViewportP *pIVar9;
  ImVec2 IVar10;
  byte bVar11;
  ImGuiContext *ctx;
  ImGuiContext *pIVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  int n_2;
  ImGuiID IVar17;
  ImGuiKeyModFlags IVar18;
  ImGuiInputSource IVar19;
  int iVar20;
  ImFont *font;
  ImGuiWindow *pIVar21;
  int i;
  ImGuiID IVar22;
  ImGuiWindow *pIVar23;
  ImGuiWindow *window;
  ImGuiNavDirSourceFlags dir_sources;
  float *pfVar24;
  long lVar25;
  ImGuiNavLayer IVar26;
  float *pfVar27;
  bool *pbVar28;
  ImGuiWindow *old_nav_window;
  ImGuiContext *g;
  long lVar29;
  ImGuiNavMoveResult *pIVar30;
  ImGuiContext *pIVar31;
  int i_1;
  ulong uVar32;
  long lVar33;
  byte bVar34;
  uint uVar35;
  uint uVar36;
  float fVar37;
  ImVec2 IVar38;
  ImVec2 IVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ImVec2 IVar46;
  undefined1 auVar47 [12];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 auVar51 [16];
  ImRect IVar52;
  long lStack_80;
  float local_78;
  ImRect local_48;
  
  ctx = GImGui;
  bVar34 = 0;
  this = &GImGui->Hooks;
  uVar32 = (ulong)(uint)(GImGui->Hooks).Size;
  lVar29 = uVar32 << 5;
  while( true ) {
    if ((int)uVar32 < 1) break;
    pIVar7 = (ctx->Hooks).Data;
    if (*(int *)(pIVar7 + lVar29 + -0x1c) == 7) {
      ImVector<ImGuiContextHook>::erase(this,pIVar7 + lVar29 + -0x20);
    }
    uVar32 = (ulong)((int)uVar32 - 1);
    lVar29 = lVar29 + -0x20;
  }
  CallContextHooks(ctx,ImGuiContextHookType_NewFramePre);
  pIVar31 = GImGui;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar31->SettingsLoaded == false) {
    pcVar8 = (pIVar31->IO).IniFilename;
    if (pcVar8 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar8);
    }
    pIVar31->SettingsLoaded = true;
  }
  if ((0.0 < pIVar31->SettingsDirtyTimer) &&
     (fVar37 = pIVar31->SettingsDirtyTimer - (pIVar31->IO).DeltaTime,
     pIVar31->SettingsDirtyTimer = fVar37, fVar37 <= 0.0)) {
    pcVar8 = (pIVar31->IO).IniFilename;
    if (pcVar8 == (char *)0x0) {
      (pIVar31->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar8);
    }
    pIVar31->SettingsDirtyTimer = 0.0;
  }
  ctx->Time = (double)(ctx->IO).DeltaTime + ctx->Time;
  ctx->WithinFrameScope = true;
  ctx->FrameCount = ctx->FrameCount + 1;
  ctx->TooltipOverrideCount = 0;
  ctx->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize(&ctx->MenusIdSubmittedThisFrame,0);
  fVar37 = (ctx->IO).DeltaTime;
  iVar20 = ctx->FramerateSecPerFrameIdx;
  ctx->FramerateSecPerFrameAccum =
       (fVar37 - ctx->FramerateSecPerFrame[iVar20]) + ctx->FramerateSecPerFrameAccum;
  ctx->FramerateSecPerFrame[iVar20] = fVar37;
  ctx->FramerateSecPerFrameIdx = (iVar20 + 1) % 0x78;
  uVar35 = -(uint)(0.0 < ctx->FramerateSecPerFrameAccum);
  (ctx->IO).Framerate =
       (float)(~uVar35 & 0x7f7fffff |
              (uint)(1.0 / (ctx->FramerateSecPerFrameAccum / 120.0)) & uVar35);
  pIVar31 = GImGui;
  pIVar9 = *(GImGui->Viewports).Data;
  (pIVar9->super_ImGuiViewport).Flags = 5;
  (pIVar9->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar9->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar9->super_ImGuiViewport).Size = (pIVar31->IO).DisplaySize;
  for (lVar29 = 0; lVar29 < (pIVar31->Viewports).Size; lVar29 = lVar29 + 1) {
    pIVar9 = (pIVar31->Viewports).Data[lVar29];
    pIVar9->WorkOffsetMin = pIVar9->CurrWorkOffsetMin;
    pIVar9->WorkOffsetMax = pIVar9->CurrWorkOffsetMax;
    (pIVar9->CurrWorkOffsetMin).x = 0.0;
    (pIVar9->CurrWorkOffsetMin).y = 0.0;
    (pIVar9->CurrWorkOffsetMax).x = 0.0;
    (pIVar9->CurrWorkOffsetMax).y = 0.0;
    ImGuiViewportP::UpdateWorkRect(pIVar9);
  }
  ((ctx->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  fVar40 = 3.4028235e+38;
  fVar41 = 3.4028235e+38;
  fVar42 = -3.4028235e+38;
  fVar37 = -3.4028235e+38;
  for (lVar29 = 0; lVar29 < (ctx->Viewports).Size; lVar29 = lVar29 + 1) {
    IVar52 = ImGuiViewportP::GetMainRect((ctx->Viewports).Data[lVar29]);
    fVar50 = IVar52.Min.x;
    if (fVar40 <= IVar52.Min.x) {
      fVar50 = fVar40;
    }
    fVar40 = fVar50;
    fVar50 = IVar52.Min.y;
    if (fVar41 <= IVar52.Min.y) {
      fVar50 = fVar41;
    }
    fVar41 = fVar50;
    fVar50 = IVar52.Max.x;
    if (IVar52.Max.x <= fVar42) {
      fVar50 = fVar42;
    }
    fVar42 = fVar50;
    if (fVar37 < IVar52.Max.y) {
      fVar37 = IVar52.Max.y;
    }
  }
  (ctx->DrawListSharedData).ClipRectFullscreen.x = fVar40;
  (ctx->DrawListSharedData).ClipRectFullscreen.y = fVar41;
  (ctx->DrawListSharedData).ClipRectFullscreen.z = fVar42;
  (ctx->DrawListSharedData).ClipRectFullscreen.w = fVar37;
  fVar37 = (ctx->Style).CircleSegmentMaxError;
  (ctx->DrawListSharedData).CurveTessellationTol = (ctx->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError(&ctx->DrawListSharedData,fVar37);
  bVar13 = (ctx->Style).AntiAliasedLines;
  uVar35 = (uint)bVar13;
  (ctx->DrawListSharedData).InitialFlags = (uint)bVar13;
  if (((ctx->Style).AntiAliasedLinesUseTex != false) &&
     ((ctx->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar35 = bVar13 | 2;
    (ctx->DrawListSharedData).InitialFlags = uVar35;
  }
  if ((ctx->Style).AntiAliasedFill == true) {
    uVar35 = uVar35 | 4;
    (ctx->DrawListSharedData).InitialFlags = uVar35;
  }
  if (((ctx->IO).BackendFlags & 8) != 0) {
    (ctx->DrawListSharedData).InitialFlags = uVar35 | 8;
  }
  for (lVar29 = 0; lVar29 < (ctx->Viewports).Size; lVar29 = lVar29 + 1) {
    pIVar9 = (ctx->Viewports).Data[lVar29];
    (pIVar9->DrawDataP).DisplaySize.x = 0.0;
    (pIVar9->DrawDataP).DisplaySize.y = 0.0;
    (pIVar9->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar9->DrawDataP).FramebufferScale.y = 0.0;
    (pIVar9->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar9->DrawDataP).DisplayPos.x = 0.0;
    (pIVar9->DrawDataP).DisplayPos.y = 0.0;
    (pIVar9->DrawDataP).Valid = false;
    *(undefined3 *)&(pIVar9->DrawDataP).field_0x1 = 0;
    (pIVar9->DrawDataP).CmdListsCount = 0;
    (pIVar9->DrawDataP).TotalIdxCount = 0;
    (pIVar9->DrawDataP).TotalVtxCount = 0;
  }
  if ((ctx->DragDropActive != false) &&
     (IVar22 = (ctx->DragDropPayload).SourceId, IVar22 == ctx->ActiveId)) {
    KeepAliveID(IVar22);
  }
  if (ctx->HoveredIdPreviousFrame == 0) {
    IVar22 = ctx->HoveredId;
    ctx->HoveredIdTimer = 0.0;
    ctx->HoveredIdNotActiveTimer = 0.0;
    if (IVar22 == 0) goto LAB_0011cdd0;
LAB_0011cda9:
    fVar37 = (ctx->IO).DeltaTime;
    ctx->HoveredIdTimer = ctx->HoveredIdTimer + fVar37;
    IVar17 = IVar22;
    if (ctx->ActiveId != IVar22) {
      ctx->HoveredIdNotActiveTimer = fVar37 + ctx->HoveredIdNotActiveTimer;
      IVar17 = ctx->ActiveId;
    }
  }
  else {
    IVar22 = ctx->HoveredId;
    if (IVar22 != 0) {
      if (ctx->ActiveId == IVar22) {
        ctx->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0011cda9;
    }
LAB_0011cdd0:
    IVar22 = 0;
    IVar17 = ctx->ActiveId;
  }
  ctx->HoveredIdPreviousFrame = IVar22;
  ctx->HoveredIdPreviousFrameUsingMouseWheel = ctx->HoveredIdUsingMouseWheel;
  ctx->HoveredId = 0;
  ctx->HoveredIdAllowOverlap = false;
  ctx->HoveredIdUsingMouseWheel = false;
  ctx->HoveredIdDisabled = false;
  if (((ctx->ActiveIdIsAlive != IVar17) && (IVar17 != 0)) && (ctx->ActiveIdPreviousFrame == IVar17))
  {
    ClearActiveID();
    IVar17 = ctx->ActiveId;
  }
  fVar37 = (ctx->IO).DeltaTime;
  if (IVar17 != 0) {
    ctx->ActiveIdTimer = ctx->ActiveIdTimer + fVar37;
  }
  ctx->LastActiveIdTimer = ctx->LastActiveIdTimer + fVar37;
  ctx->ActiveIdPreviousFrame = IVar17;
  ctx->ActiveIdPreviousFrameWindow = ctx->ActiveIdWindow;
  ctx->ActiveIdPreviousFrameHasBeenEditedBefore = ctx->ActiveIdHasBeenEditedBefore;
  ctx->ActiveIdIsAlive = 0;
  ctx->ActiveIdHasBeenEditedThisFrame = false;
  ctx->ActiveIdPreviousFrameIsAlive = false;
  ctx->ActiveIdIsJustActivated = false;
  if (ctx->TempInputId == 0) {
LAB_0011ceb2:
    if (IVar17 == 0) {
      ctx->ActiveIdUsingNavDirMask = 0;
      ctx->ActiveIdUsingNavInputMask = 0;
      ctx->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar17 != ctx->TempInputId) {
    ctx->TempInputId = 0;
    goto LAB_0011ceb2;
  }
  ctx->DragDropAcceptIdPrev = ctx->DragDropAcceptIdCurr;
  ctx->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  ctx->DragDropAcceptIdCurr = 0;
  ctx->DragDropWithinSource = false;
  ctx->DragDropWithinTarget = false;
  ctx->DragDropHoldJustPressedId = 0;
  IVar18 = GetMergedKeyModFlags();
  (ctx->IO).KeyMods = IVar18;
  memcpy((ctx->IO).KeysDownDurationPrev,(ctx->IO).KeysDownDuration,0x800);
  for (lVar29 = 0x144; pIVar31 = GImGui, lVar29 != 0x344; lVar29 = lVar29 + 1) {
    fVar40 = -1.0;
    if (*(char *)((long)(ctx->IO).KeyMap + lVar29 + -0x3c) == '\x01') {
      fVar41 = *(float *)((long)ctx + lVar29 * 4 + -0x70);
      fVar40 = 0.0;
      if (0.0 <= fVar41) {
        fVar40 = fVar41 + fVar37;
      }
    }
    *(float *)((long)ctx + lVar29 * 4 + -0x70) = fVar40;
  }
  (GImGui->IO).WantSetMousePos = false;
  pIVar31->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar31->NavWrapRequestFlags = 0;
  uVar35 = (pIVar31->IO).ConfigFlags;
  if (((uVar35 & 2) == 0) || (((pIVar31->IO).BackendFlags & 1) == 0)) {
    bVar11 = 0;
  }
  else {
    bVar11 = 1;
    if ((pIVar31->NavInputSource != ImGuiInputSource_NavGamepad) &&
       (((0.0 < (pIVar31->IO).NavInputs[0] || (0.0 < (pIVar31->IO).NavInputs[2])) ||
        ((0.0 < (pIVar31->IO).NavInputs[1] ||
         ((((0.0 < (pIVar31->IO).NavInputs[3] || (0.0 < (pIVar31->IO).NavInputs[4])) ||
           (0.0 < (pIVar31->IO).NavInputs[5])) ||
          ((0.0 < (pIVar31->IO).NavInputs[6] || (0.0 < (pIVar31->IO).NavInputs[7])))))))))) {
      pIVar31->NavInputSource = ImGuiInputSource_NavGamepad;
    }
  }
  if ((uVar35 & 1) != 0) {
    lVar29 = (long)(pIVar31->IO).KeyMap[0xc];
    if ((-1 < lVar29) && ((pIVar31->IO).KeysDown[lVar29] == true)) {
      (pIVar31->IO).NavInputs[0] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar29 = (long)(pIVar31->IO).KeyMap[0xd];
    if ((-1 < lVar29) && ((pIVar31->IO).KeysDown[lVar29] == true)) {
      (pIVar31->IO).NavInputs[2] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar29 = (long)(pIVar31->IO).KeyMap[0xe];
    if ((-1 < lVar29) && ((pIVar31->IO).KeysDown[lVar29] == true)) {
      (pIVar31->IO).NavInputs[1] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar29 = (long)(pIVar31->IO).KeyMap[1];
    if ((-1 < lVar29) && ((pIVar31->IO).KeysDown[lVar29] == true)) {
      (pIVar31->IO).NavInputs[0x11] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar29 = (long)(pIVar31->IO).KeyMap[2];
    if ((-1 < lVar29) && ((pIVar31->IO).KeysDown[lVar29] == true)) {
      (pIVar31->IO).NavInputs[0x12] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar29 = (long)(pIVar31->IO).KeyMap[3];
    if ((-1 < lVar29) && ((pIVar31->IO).KeysDown[lVar29] == true)) {
      (pIVar31->IO).NavInputs[0x13] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar29 = (long)(pIVar31->IO).KeyMap[4];
    if ((-1 < lVar29) && ((pIVar31->IO).KeysDown[lVar29] == true)) {
      (pIVar31->IO).NavInputs[0x14] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar13 = (pIVar31->IO).KeyCtrl;
    if (bVar13 == true) {
      (pIVar31->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar31->IO).KeyShift == true) {
      (pIVar31->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar13 == false) && ((pIVar31->IO).KeyAlt != false)) {
      (pIVar31->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar4 = (pIVar31->IO).NavInputsDownDuration;
  pfVar24 = pfVar4;
  pfVar27 = (pIVar31->IO).NavInputsDownDurationPrev;
  for (lVar29 = 0x15; lVar29 != 0; lVar29 = lVar29 + -1) {
    *pfVar27 = *pfVar24;
    pfVar24 = pfVar24 + (ulong)bVar34 * -2 + 1;
    pfVar27 = pfVar27 + (ulong)bVar34 * -2 + 1;
  }
  for (lVar29 = 0; lVar29 != 0x15; lVar29 = lVar29 + 1) {
    fVar37 = -1.0;
    if (0.0 < (pIVar31->IO).NavInputs[lVar29]) {
      fVar37 = 0.0;
      if (0.0 <= pfVar4[lVar29]) {
        fVar37 = pfVar4[lVar29] + (pIVar31->IO).DeltaTime;
      }
    }
    pfVar4[lVar29] = fVar37;
  }
  IVar22 = pIVar31->NavInitResultId;
  if ((IVar22 != 0) &&
     (((pIVar31->NavDisableHighlight != true || (pIVar31->NavInitRequestFromMove == true)) &&
      (pIVar21 = pIVar31->NavWindow, pIVar21 != (ImGuiWindow *)0x0)))) {
    IVar26 = pIVar31->NavLayer;
    if (pIVar31->NavInitRequestFromMove == true) {
      SetNavIDWithRectRel(IVar22,IVar26,0,&pIVar31->NavInitResultRectRel);
      pIVar21 = pIVar31->NavWindow;
      IVar26 = pIVar31->NavLayer;
    }
    else {
      pIVar31->NavId = IVar22;
      pIVar31->NavFocusScopeId = 0;
      pIVar21->NavLastIds[(int)IVar26] = IVar22;
    }
    IVar38 = (pIVar31->NavInitResultRectRel).Max;
    pIVar21->NavRectRel[IVar26].Min = (pIVar31->NavInitResultRectRel).Min;
    (&pIVar21->NavRectRel[IVar26].Min)[1] = IVar38;
  }
  pIVar31->NavInitRequest = false;
  pIVar31->NavInitRequestFromMove = false;
  pIVar31->NavInitResultId = 0;
  pIVar31->NavJustMovedToId = 0;
  pIVar12 = GImGui;
  if (pIVar31->NavMoveRequest == true) {
    IVar22 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar22 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar12->NavDisableHighlight = false;
        pIVar12->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar1 = &GImGui->NavMoveResultOther;
      pIVar30 = &GImGui->NavMoveResultLocal;
      if (IVar22 == 0) {
        pIVar30 = pIVar1;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar22 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar22 != 0)) &&
         (IVar22 != GImGui->NavId)) {
        pIVar30 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar30 == pIVar1) {
LAB_0011d3a7:
        pIVar30 = pIVar1;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar37 = (GImGui->NavMoveResultOther).DistBox;
        fVar40 = pIVar30->DistBox;
        if (fVar40 <= fVar37) {
          if (((fVar37 != fVar40) || (NAN(fVar37) || NAN(fVar40))) ||
             (pfVar4 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar30->DistCenter < *pfVar4 || pIVar30->DistCenter == *pfVar4)) goto LAB_0011d3aa;
        }
        goto LAB_0011d3a7;
      }
LAB_0011d3aa:
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar38 = pIVar30->Window->Pos;
          IVar46 = (pIVar30->RectRel).Min;
          fVar37 = IVar38.x;
          fVar40 = IVar38.y;
          IVar38 = (pIVar30->RectRel).Max;
          local_48.Max.x = IVar38.x + fVar37;
          local_48.Max.y = IVar38.y + fVar40;
          local_48.Min.y = IVar46.y + fVar40;
          local_48.Min.x = IVar46.x + fVar37;
          IVar38 = ScrollToBringRectIntoView(pIVar30->Window,&local_48);
        }
        else {
          pIVar21 = pIVar30->Window;
          fVar37 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar37 = (pIVar21->ScrollMax).y;
          }
          (pIVar21->ScrollTarget).y = fVar37;
          (pIVar21->ScrollTargetCenterRatio).y = 0.0;
          IVar38 = (ImVec2)((ulong)(uint)((pIVar21->Scroll).y - fVar37) << 0x20);
          (pIVar21->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        fVar37 = (pIVar30->RectRel).Min.y;
        fVar40 = (pIVar30->RectRel).Max.x;
        fVar41 = (pIVar30->RectRel).Max.y;
        (pIVar30->RectRel).Min.x = (pIVar30->RectRel).Min.x - IVar38.x;
        (pIVar30->RectRel).Min.y = fVar37 - IVar38.y;
        (pIVar30->RectRel).Max.x = fVar40 - IVar38.x;
        (pIVar30->RectRel).Max.y = fVar41 - IVar38.y;
      }
      ClearActiveID();
      pIVar12->NavWindow = pIVar30->Window;
      IVar22 = pIVar30->ID;
      if (pIVar12->NavId == IVar22) {
        IVar17 = pIVar30->FocusScopeId;
      }
      else {
        pIVar12->NavJustMovedToId = IVar22;
        IVar17 = pIVar30->FocusScopeId;
        pIVar12->NavJustMovedToFocusScopeId = IVar17;
        pIVar12->NavJustMovedToKeyMods = pIVar12->NavMoveRequestKeyMods;
      }
      SetNavIDWithRectRel(IVar22,pIVar12->NavLayer,IVar17,&pIVar30->RectRel);
    }
  }
  if (pIVar31->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (((pIVar31->NavMoveResultLocal).ID == 0) && ((pIVar31->NavMoveResultOther).ID == 0)) {
      pIVar31->NavDisableHighlight = false;
    }
    pIVar31->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar31->NavMousePosDirty == true) && (pIVar31->NavIdIsAlive == true)) {
    if ((((pIVar31->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar31->IO).BackendFlags & 4) != 0 && (pIVar31->NavDisableHighlight == false)) &&
         (pIVar31->NavDisableMouseHover == true)) && (pIVar31->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar38 = NavCalcPreferredRefPos();
      (pIVar31->IO).MousePosPrev = IVar38;
      (pIVar31->IO).MousePos = IVar38;
      (pIVar31->IO).WantSetMousePos = true;
    }
    pIVar31->NavMousePosDirty = false;
  }
  pIVar31->NavIdIsAlive = false;
  pIVar31->NavJustTabbedId = 0;
  pIVar21 = pIVar31->NavWindow;
  pIVar23 = pIVar21;
  if (pIVar21 != (ImGuiWindow *)0x0) {
    for (; pIVar23 != (ImGuiWindow *)0x0; pIVar23 = pIVar23->ParentWindow) {
      if ((pIVar23->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar23 != pIVar21) {
          pIVar23->NavLastChildNavWindow = pIVar21;
        }
        break;
      }
    }
    if ((pIVar21->NavLastChildNavWindow != (ImGuiWindow *)0x0) &&
       (pIVar31->NavLayer == ImGuiNavLayer_Main)) {
      pIVar21->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar12 = GImGui;
  pIVar21 = GetTopMostPopupModal();
  if (pIVar21 != (ImGuiWindow *)0x0) {
    pIVar12->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar12->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar37 = (pIVar12->IO).DeltaTime * -10.0 + pIVar12->NavWindowingHighlightAlpha;
    fVar37 = (float)(-(uint)(0.0 <= fVar37) & (uint)fVar37);
    pIVar12->NavWindowingHighlightAlpha = fVar37;
    if ((pIVar12->DimBgRatio <= 0.0) && (fVar37 <= 0.0)) {
      pIVar12->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar21 == (ImGuiWindow *)0x0) && (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar13 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
    if ((pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0) &&
       (((pIVar12->IO).KeyCtrl == true && (bVar14 = IsKeyPressedMap(0,true), bVar14)))) {
      bVar34 = (byte)(pIVar12->IO).ConfigFlags;
      uVar36 = (uint)bVar34;
      if (bVar13 || (bVar34 & 1) != 0) {
LAB_0011d65f:
        pIVar21 = pIVar12->NavWindow;
        if ((pIVar21 != (ImGuiWindow *)0x0) ||
           (pIVar21 = FindWindowNavFocusable((pIVar12->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
           pIVar21 != (ImGuiWindow *)0x0)) {
          pIVar21 = pIVar21->RootWindow;
          pIVar12->NavWindowingTargetAnim = pIVar21;
          pIVar12->NavWindowingTarget = pIVar21;
          pIVar12->NavWindowingTimer = 0.0;
          pIVar12->NavWindowingHighlightAlpha = 0.0;
          pIVar12->NavWindowingToggleLayer = (bool)(~(byte)uVar36 & 1);
          pIVar12->NavInputSource = ImGuiInputSource_NavGamepad - (uVar36 & 1);
        }
      }
    }
    else if (bVar13) {
      uVar36 = 0;
      goto LAB_0011d65f;
    }
  }
  fVar37 = (pIVar12->IO).DeltaTime + pIVar12->NavWindowingTimer;
  pIVar12->NavWindowingTimer = fVar37;
  if (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_0011d838:
    bVar13 = false;
    pIVar21 = (ImGuiWindow *)0x0;
  }
  else {
    IVar19 = pIVar12->NavInputSource;
    if (IVar19 != ImGuiInputSource_NavGamepad) {
LAB_0011d7ab:
      if (IVar19 == ImGuiInputSource_NavKeyboard) {
        fVar40 = (pIVar12->NavWindowingTimer + -0.2) / 0.05;
        fVar37 = 1.0;
        if (fVar40 <= 1.0) {
          fVar37 = fVar40;
        }
        fVar37 = (float)(~-(uint)(fVar40 < 0.0) & (uint)fVar37);
        uVar36 = -(uint)(fVar37 <= pIVar12->NavWindowingHighlightAlpha);
        pIVar12->NavWindowingHighlightAlpha =
             (float)(uVar36 & (uint)pIVar12->NavWindowingHighlightAlpha | ~uVar36 & (uint)fVar37);
        bVar13 = IsKeyPressedMap(0,true);
        if (bVar13) {
          NavUpdateWindowingHighlightWindow((pIVar12->IO).KeyShift - 1 | 1);
        }
        if ((pIVar12->IO).KeyCtrl == false) {
          pIVar21 = pIVar12->NavWindowingTarget;
          bVar13 = false;
          goto LAB_0011d843;
        }
      }
      goto LAB_0011d838;
    }
    fVar40 = (fVar37 + -0.2) / 0.05;
    fVar37 = 1.0;
    if (fVar40 <= 1.0) {
      fVar37 = fVar40;
    }
    fVar37 = (float)(~-(uint)(fVar40 < 0.0) & (uint)fVar37);
    uVar36 = -(uint)(fVar37 <= pIVar12->NavWindowingHighlightAlpha);
    pIVar12->NavWindowingHighlightAlpha =
         (float)(uVar36 & (uint)pIVar12->NavWindowingHighlightAlpha | ~uVar36 & (uint)fVar37);
    bVar13 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar14 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
    if ((uint)bVar13 - (uint)bVar14 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar13 - (uint)bVar14);
      pIVar12->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0011d838;
      IVar19 = pIVar12->NavInputSource;
      goto LAB_0011d7ab;
    }
    pbVar28 = &pIVar12->NavWindowingToggleLayer;
    *pbVar28 = (bool)(*pbVar28 &
                     (pIVar12->NavWindowingHighlightAlpha <= 1.0 &&
                     pIVar12->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar28 == false) {
      pIVar21 = pIVar12->NavWindowingTarget;
      bVar13 = false;
    }
    else {
      bVar13 = pIVar12->NavWindow != (ImGuiWindow *)0x0;
      pIVar21 = (ImGuiWindow *)0x0;
    }
    pIVar12->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_0011d843:
  dir_sources = 1;
  bVar14 = IsNavInputTest(0x10,ImGuiInputReadMode_Pressed);
  if (bVar14) {
    pIVar12->NavWindowingToggleLayer = true;
  }
  if ((((pIVar12->ActiveId == 0) || (pIVar12->ActiveIdAllowOverlap == true)) &&
      (pIVar12->NavWindowingToggleLayer == true)) &&
     (bVar14 = IsNavInputTest(0x10,ImGuiInputReadMode_Released), bVar14)) {
    bVar13 = (bool)(((pIVar12->IO).MousePosPrev.y < -256000.0 ||
                    (pIVar12->IO).MousePosPrev.x < -256000.0) !=
                    (-256000.0 <= (pIVar12->IO).MousePos.y && -256000.0 <= (pIVar12->IO).MousePos.x)
                   | bVar13);
  }
  pIVar23 = pIVar12->NavWindowingTarget;
  if ((pIVar23 != (ImGuiWindow *)0x0) && ((pIVar23->Flags & 4) == 0)) {
    if (pIVar12->NavInputSource == ImGuiInputSource_NavGamepad) {
      dir_sources = 4;
LAB_0011d95b:
      IVar38 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
    }
    else {
      IVar38.x = 0.0;
      IVar38.y = 0.0;
      if ((pIVar12->NavInputSource == ImGuiInputSource_NavKeyboard) &&
         ((pIVar12->IO).KeyShift == false)) goto LAB_0011d95b;
    }
    fVar37 = IVar38.x;
    fVar40 = IVar38.y;
    if ((((fVar37 != 0.0) || (NAN(fVar37))) || (fVar40 != 0.0)) || (NAN(fVar40))) {
      fVar41 = (pIVar12->IO).DisplayFramebufferScale.x;
      fVar42 = (pIVar12->IO).DisplayFramebufferScale.y;
      if (fVar42 <= fVar41) {
        fVar41 = fVar42;
      }
      fVar41 = (float)(int)(fVar41 * (pIVar12->IO).DeltaTime * 800.0);
      pIVar23 = pIVar23->RootWindow;
      local_48.Min.y = (pIVar23->Pos).y + fVar40 * fVar41;
      local_48.Min.x = (pIVar23->Pos).x + fVar37 * fVar41;
      SetWindowPos(pIVar23,&local_48.Min,1);
      MarkIniSettingsDirty(pIVar23);
      pIVar12->NavDisableMouseHover = true;
    }
  }
  if (pIVar21 != (ImGuiWindow *)0x0) {
    if ((pIVar12->NavWindow == (ImGuiWindow *)0x0) || (pIVar21 != pIVar12->NavWindow->RootWindow)) {
      ClearActiveID();
      pIVar12->NavDisableHighlight = false;
      pIVar12->NavDisableMouseHover = true;
      pIVar23 = pIVar21->NavLastChildNavWindow;
      if ((pIVar23 == (ImGuiWindow *)0x0) || (pIVar23->WasActive == false)) {
        pIVar23 = pIVar21;
      }
      ClosePopupsOverWindow(pIVar23,false);
      FocusWindow(pIVar23);
      if (pIVar23->NavLastIds[0] == 0) {
        NavInitWindow(pIVar23,false);
      }
      if ((pIVar23->DC).NavLayerActiveMask == 2) {
        pIVar12->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar12->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar13) && (pIVar21 = pIVar12->NavWindow, pIVar23 = pIVar21, pIVar21 != (ImGuiWindow *)0x0))
  {
    while (window = pIVar23, window->ParentWindow != (ImGuiWindow *)0x0) {
      if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
         (pIVar23 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
    }
    if (window != pIVar21) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar21;
      pIVar21 = pIVar12->NavWindow;
    }
    pIVar12->NavDisableHighlight = false;
    pIVar12->NavDisableMouseHover = true;
    IVar26 = ImGuiNavLayer_Main;
    if (((pIVar21->DC).NavLayerActiveMask & 2) != 0) {
      IVar26 = pIVar12->NavLayer ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(IVar26);
  }
  if (((bool)((uVar35 & 1) == 0 & (bVar11 ^ 1))) || (pIVar31->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar31->IO).NavActive = false;
LAB_0011db56:
    bVar13 = pIVar31->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar13 = (pIVar31->NavWindow->Flags & 0x40000U) == 0;
    (pIVar31->IO).NavActive = bVar13;
    if (((!bVar13) || (pIVar31->NavId == 0)) ||
       (bVar13 = true, pIVar31->NavDisableHighlight != false)) goto LAB_0011db56;
  }
  (pIVar31->IO).NavVisible = bVar13;
  bVar13 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar13) {
    if (pIVar31->ActiveId == 0) {
      pIVar21 = pIVar31->NavWindow;
      if (((pIVar21 == (ImGuiWindow *)0x0) || ((pIVar21->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar21->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar20 = (pIVar31->OpenPopupStack).Size;
        if ((long)iVar20 < 1) {
          if (pIVar31->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar21 != (ImGuiWindow *)0x0) && ((pIVar21->Flags & 0x5000000U) != 0x1000000)) {
              pIVar21->NavLastIds[0] = 0;
            }
            pIVar31->NavId = 0;
            pIVar31->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar31->OpenPopupStack).Data[(long)iVar20 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar20 + -1,true);
        }
      }
      else {
        FocusWindow(pIVar21->ParentWindow);
        pIVar12 = GImGui;
        IVar22 = pIVar21->ChildId;
        GImGui->NavId = IVar22;
        pIVar12->NavFocusScopeId = 0;
        pIVar12->NavWindow->NavLastIds[0] = IVar22;
        pIVar31->NavIdIsAlive = false;
        if (pIVar31->NavDisableMouseHover == true) {
          pIVar31->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar31->NavActivateId = 0;
  pIVar31->NavActivateDownId = 0;
  pIVar31->NavActivatePressedId = 0;
  pIVar31->NavInputId = 0;
  if (((pIVar31->NavId == 0) || (pIVar31->NavDisableHighlight != false)) ||
     (pIVar31->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_0011dd04:
    pIVar21 = pIVar31->NavWindow;
    if (pIVar21 == (ImGuiWindow *)0x0) goto LAB_0011dd6a;
    if ((pIVar21->Flags & 0x40000) != 0) {
      pIVar31->NavDisableHighlight = true;
    }
    bVar13 = false;
  }
  else {
    if (pIVar31->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar31->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          bVar13 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
          IVar22 = pIVar31->ActiveId;
          IVar17 = pIVar31->NavId;
          if (IVar22 == 0 && bVar13) {
            pIVar31->NavActivateId = IVar17;
            pIVar31->NavActivateDownId = IVar17;
LAB_0011e10f:
            pIVar31->NavActivatePressedId = IVar17;
          }
          else if (IVar22 == 0) {
            pIVar31->NavActivateDownId = IVar17;
            if (bVar13) goto LAB_0011e10f;
          }
          else {
            bVar14 = IVar22 == IVar17;
            if (!bVar14) goto LAB_0011dd04;
            pIVar31->NavActivateDownId = IVar22;
            IVar17 = IVar22;
            if (bVar13 && bVar14) goto LAB_0011e10f;
          }
LAB_0011e117:
          bVar13 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
          if (bVar13) {
            pIVar31->NavInputId = pIVar31->NavId;
          }
        }
        else if (pIVar31->ActiveId == pIVar31->NavId || pIVar31->ActiveId == 0) goto LAB_0011e117;
      }
      goto LAB_0011dd04;
    }
LAB_0011dd6a:
    bVar13 = true;
    pIVar21 = (ImGuiWindow *)0x0;
  }
  pIVar31->NavMoveRequest = false;
  IVar22 = pIVar31->NavNextActivateId;
  if (IVar22 != 0) {
    pIVar31->NavActivateId = IVar22;
    pIVar31->NavActivateDownId = IVar22;
    pIVar31->NavActivatePressedId = IVar22;
    pIVar31->NavInputId = IVar22;
  }
  pIVar31->NavNextActivateId = 0;
  if (pIVar31->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar31->NavMoveDir = -1;
    pIVar31->NavMoveRequestFlags = 0;
    if (((!bVar13) && (pIVar31->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar21->Flags & 0x40000) == 0)) {
      if (((GImGui->ActiveIdUsingNavDirMask & 1) == 0) &&
         ((bVar13 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar13 ||
          (bVar13 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar13)))) {
        pIVar31->NavMoveDir = 0;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
         ((bVar13 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar13 ||
          (bVar13 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar13)))) {
        pIVar31->NavMoveDir = 1;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
         ((bVar13 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar13 ||
          (bVar13 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar13)))) {
        pIVar31->NavMoveDir = 2;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
         ((bVar13 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar13 ||
          (bVar13 = IsNavInputTest(0x14,ImGuiInputReadMode_Repeat), bVar13)))) {
        pIVar31->NavMoveDir = 3;
      }
    }
    pIVar31->NavMoveClipDir = pIVar31->NavMoveDir;
  }
  else {
    pIVar31->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar12 = GImGui;
  fVar37 = 0.0;
  if ((((((uVar35 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar21 = GImGui->NavWindow, pIVar21 != (ImGuiWindow *)0x0)) &&
      (((pIVar21->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    iVar20 = (GImGui->IO).KeyMap[5];
    bVar14 = false;
    bVar13 = false;
    if ((-1 < (long)iVar20) && ((GImGui->IO).KeysDown[iVar20] == true)) {
      bVar13 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    user_key_index = (GImGui->IO).KeyMap[6];
    if ((-1 < (long)user_key_index) && ((GImGui->IO).KeysDown[user_key_index] == true)) {
      bVar14 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar15 = IsKeyPressed((GImGui->IO).KeyMap[7],true);
    if (bVar15) {
      bVar15 = (pIVar12->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar15 = false;
    }
    bVar16 = IsKeyPressed((pIVar12->IO).KeyMap[8],true);
    if (bVar16) {
      bVar16 = (pIVar12->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar16 = false;
    }
    fVar37 = 0.0;
    if ((bVar13 != bVar14) || (bVar15 != bVar16)) {
      if (((pIVar21->DC).NavLayerActiveMask == 0) && ((pIVar21->DC).NavHasScroll == true)) {
        bVar13 = IsKeyPressed(iVar20,true);
        if (bVar13) {
          fVar37 = (pIVar21->Scroll).y - ((pIVar21->InnerRect).Max.y - (pIVar21->InnerRect).Min.y);
LAB_0011f210:
          (pIVar21->ScrollTarget).y = fVar37;
LAB_0011f216:
          (pIVar21->ScrollTargetCenterRatio).y = 0.0;
          (pIVar21->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        else {
          bVar13 = IsKeyPressed(user_key_index,true);
          if (bVar13) {
            fVar37 = ((pIVar21->InnerRect).Max.y - (pIVar21->InnerRect).Min.y) + (pIVar21->Scroll).y
            ;
            goto LAB_0011f210;
          }
          if (bVar15 != false) {
            (pIVar21->ScrollTarget).y = 0.0;
            goto LAB_0011f216;
          }
          if (bVar16 != false) {
            fVar37 = (pIVar21->ScrollMax).y;
            goto LAB_0011f210;
          }
        }
        fVar37 = 0.0;
      }
      else {
        fVar37 = (pIVar21->InnerRect).Max.y;
        fVar40 = (pIVar21->InnerRect).Min.y;
        fVar41 = ImGuiWindow::CalcFontSize(pIVar21);
        fVar37 = (pIVar21->NavRectRel[0].Max.y - pIVar21->NavRectRel[0].Min.y) +
                 ((fVar37 - fVar40) - fVar41);
        fVar37 = (float)(~-(uint)(fVar37 <= 0.0) & (uint)fVar37);
        bVar13 = IsKeyPressed((pIVar12->IO).KeyMap[5],true);
        if (bVar13) {
          fVar37 = -fVar37;
          pIVar12->NavMoveDir = 3;
          pIVar12->NavMoveClipDir = 2;
          pIVar12->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar13 = IsKeyPressed((pIVar12->IO).KeyMap[6],true);
          if (bVar13) {
            pIVar12->NavMoveDir = 2;
            pIVar12->NavMoveClipDir = 3;
            pIVar12->NavMoveRequestFlags = 0x30;
          }
          else if (bVar15 == false) {
            fVar37 = 0.0;
            if (bVar16 != false) {
              fVar40 = ((pIVar21->ScrollMax).y + (pIVar21->SizeFull).y) - (pIVar21->Scroll).y;
              pIVar21->NavRectRel[0].Max.y = fVar40;
              pIVar21->NavRectRel[0].Min.y = fVar40;
              fVar40 = pIVar21->NavRectRel[0].Min.x;
              pIVar3 = &pIVar21->NavRectRel[0].Max;
              if (pIVar3->x <= fVar40 && fVar40 != pIVar3->x) {
                pIVar21->NavRectRel[0].Max.x = 0.0;
                pIVar21->NavRectRel[0].Min.x = 0.0;
              }
              pIVar12->NavMoveDir = 2;
              pIVar12->NavMoveRequestFlags = 0x50;
            }
          }
          else {
            fVar37 = -(pIVar21->Scroll).y;
            pIVar21->NavRectRel[0].Max.y = fVar37;
            pIVar21->NavRectRel[0].Min.y = fVar37;
            fVar37 = pIVar21->NavRectRel[0].Min.x;
            pIVar3 = &pIVar21->NavRectRel[0].Max;
            if (pIVar3->x <= fVar37 && fVar37 != pIVar3->x) {
              pIVar21->NavRectRel[0].Max.x = 0.0;
              pIVar21->NavRectRel[0].Min.x = 0.0;
            }
            pIVar12->NavMoveDir = 3;
            pIVar12->NavMoveRequestFlags = 0x50;
            fVar37 = 0.0;
          }
        }
      }
    }
  }
  if (pIVar31->NavMoveDir == -1) {
    if ((pIVar31->NavMoveRequest & 1U) != 0) goto LAB_0011df36;
  }
  else {
    pIVar31->NavMoveRequest = true;
    pIVar31->NavMoveRequestKeyMods = (pIVar31->IO).KeyMods;
    pIVar31->NavMoveDirLast = pIVar31->NavMoveDir;
LAB_0011df36:
    if (pIVar31->NavId == 0) {
      pIVar31->NavInitRequest = true;
      pIVar31->NavInitRequestFromMove = true;
      pIVar31->NavInitResultId = 0;
      pIVar31->NavDisableHighlight = false;
    }
  }
  bVar13 = true;
  if (GImGui->NavMoveRequest == false) {
    bVar13 = GImGui->NavInitRequest;
  }
  GImGui->NavAnyRequest = bVar13;
  pIVar21 = pIVar31->NavWindow;
  if (((pIVar21 != (ImGuiWindow *)0x0) && ((pIVar21->Flags & 0x40000) == 0)) &&
     (pIVar31->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar40 = ImGuiWindow::CalcFontSize(pIVar21);
    fVar40 = (float)(int)(fVar40 * 100.0 * (pIVar31->IO).DeltaTime + 0.5);
    if ((((pIVar21->DC).NavLayerActiveMask == 0) && ((pIVar21->DC).NavHasScroll == true)) &&
       (pIVar31->NavMoveRequest == true)) {
      uVar35 = pIVar31->NavMoveDir;
      if (uVar35 < 2) {
        lVar29 = 0x7c;
        lVar33 = 0x74;
        lVar25 = 0x6c;
        uVar36 = 0;
        lStack_80 = 0x5c;
      }
      else {
        if ((uVar35 & 0xfffffffe) != 2) goto LAB_0011e1b4;
        uVar36 = 2;
        lVar29 = 0x80;
        lVar33 = 0x78;
        lVar25 = 0x70;
        lStack_80 = 0x60;
      }
      *(float *)((long)&pIVar21->Name + lVar25) =
           (float)(int)(*(float *)(&DAT_00166914 + (ulong)(uVar35 == uVar36) * 4) * fVar40 +
                       *(float *)((long)&pIVar21->Name + lStack_80));
      *(undefined4 *)((long)&pIVar21->Name + lVar33) = 0;
      *(undefined4 *)((long)&pIVar21->Name + lVar29) = 0;
    }
LAB_0011e1b4:
    IVar38 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar41 = IVar38.x;
    fVar42 = IVar38.y;
    if (((fVar41 != 0.0) || (NAN(fVar41))) && (pIVar21->ScrollbarX == true)) {
      (pIVar21->ScrollTarget).x = (float)(int)(fVar41 * fVar40 + (pIVar21->Scroll).x);
      (pIVar21->ScrollTargetCenterRatio).x = 0.0;
      (pIVar21->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar42 != 0.0) || (NAN(fVar42))) {
      (pIVar21->ScrollTarget).y = (float)(int)(fVar42 * fVar40 + (pIVar21->Scroll).y);
      (pIVar21->ScrollTargetCenterRatio).y = 0.0;
      (pIVar21->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  (pIVar31->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar31->NavMoveResultLocal).ID = 0;
  (pIVar31->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar31->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar31->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar31->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar31->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar31->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar31->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar31->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar31->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar31->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar31->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar31->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar31->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar31->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar31->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar31->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar31->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar31->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar31->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar31->NavMoveResultOther).ID = 0;
  (pIVar31->NavMoveResultOther).FocusScopeId = 0;
  (pIVar31->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar31->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar31->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar31->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar31->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar31->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar31->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((pIVar31->NavMoveRequest == true) && (pIVar31->NavInputSource == ImGuiInputSource_NavGamepad)
      ) && (pIVar31->NavLayer == ImGuiNavLayer_Main)) {
    pIVar21 = pIVar31->NavWindow;
    IVar38 = (pIVar21->InnerRect).Min;
    fVar40 = (pIVar21->Pos).x;
    fVar41 = (pIVar21->Pos).y;
    IVar46 = (pIVar21->InnerRect).Max;
    local_48.Max.x = (IVar46.x - fVar40) + 1.0;
    local_48.Max.y = (IVar46.y - fVar41) + 1.0;
    local_48.Min.y = (IVar38.y - fVar41) + -1.0;
    local_48.Min.x = (IVar38.x - fVar40) + -1.0;
    bVar13 = ImRect::Contains(&local_48,pIVar21->NavRectRel);
    if (!bVar13) {
      fVar40 = ImGuiWindow::CalcFontSize(pIVar21);
      auVar44._0_4_ = fVar40 * 0.5;
      auVar43._0_4_ = local_48.Max.x - local_48.Min.x;
      auVar43._4_4_ = local_48.Max.y - local_48.Min.y;
      auVar43._8_4_ = local_48.Max.x - local_48.Max.x;
      auVar43._12_4_ = local_48.Max.y - local_48.Max.y;
      auVar44._4_4_ = auVar44._0_4_;
      auVar44._8_4_ = auVar44._0_4_;
      auVar44._12_4_ = auVar44._0_4_;
      auVar44 = minps(auVar43,auVar44);
      local_48.Max.x = local_48.Max.x - auVar44._0_4_;
      local_48.Max.y = local_48.Max.y - auVar44._4_4_;
      local_48.Min.y = auVar44._4_4_ + local_48.Min.y;
      local_48.Min.x = auVar44._0_4_ + local_48.Min.x;
      ImRect::ClipWithFull(pIVar21->NavRectRel + pIVar31->NavLayer,&local_48);
      pIVar31->NavId = 0;
      pIVar31->NavFocusScopeId = 0;
    }
  }
  pIVar21 = pIVar31->NavWindow;
  if (pIVar21 == (ImGuiWindow *)0x0) {
    fVar42 = 0.0;
    fVar40 = 0.0;
    fVar41 = 0.0;
    auVar47 = ZEXT812(0x3f800000);
  }
  else {
    IVar26 = pIVar31->NavLayer;
    fVar50 = (pIVar21->Pos).x;
    fVar40 = (pIVar21->Pos).y;
    fVar42 = pIVar21->NavRectRel[IVar26].Min.y + fVar40;
    fVar41 = fVar50 + pIVar21->NavRectRel[IVar26].Max.x;
    fVar40 = fVar40 + pIVar21->NavRectRel[IVar26].Max.y;
    auVar47._4_8_ = 0;
    auVar47._0_4_ = pIVar21->NavRectRel[IVar26].Min.x + fVar50 + 1.0;
  }
  if (fVar41 <= auVar47._0_4_) {
    auVar47._4_8_ = auVar47._4_8_;
    auVar47._0_4_ = fVar41;
  }
  (pIVar31->NavScoringRect).Min.y = fVar42 + fVar37;
  (pIVar31->NavScoringRect).Max.y = fVar40 + fVar37;
  (pIVar31->NavScoringRect).Min.x = auVar47._0_4_;
  (pIVar31->NavScoringRect).Max.x = auVar47._0_4_;
  pIVar31->NavScoringCount = 0;
  pIVar31 = GImGui;
  fVar37 = (GImGui->IO).MousePos.x;
  fVar40 = (GImGui->IO).MousePos.y;
  if ((-256000.0 <= fVar37) && (-256000.0 <= fVar40)) {
    fVar37 = (float)(int)fVar37;
    fVar40 = (float)(int)fVar40;
    (GImGui->LastValidMousePos).x = fVar37;
    (pIVar31->LastValidMousePos).y = fVar40;
    (pIVar31->IO).MousePos.x = fVar37;
    (pIVar31->IO).MousePos.y = fVar40;
  }
  if ((fVar37 < -256000.0) || (fVar40 < -256000.0)) {
LAB_0011e4df:
    (pIVar31->IO).MouseDelta.x = 0.0;
    (pIVar31->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar38 = (pIVar31->IO).MousePosPrev;
    fVar41 = IVar38.x;
    if ((fVar41 < -256000.0) || (fVar42 = IVar38.y, fVar42 < -256000.0)) goto LAB_0011e4df;
    IVar46.x = fVar37 - fVar41;
    IVar46.y = fVar40 - fVar42;
    (pIVar31->IO).MouseDelta = IVar46;
    if ((((IVar46.x != 0.0) || (NAN(IVar46.x))) || (IVar46.y != 0.0)) || (NAN(IVar46.y))) {
      pIVar31->NavDisableMouseHover = false;
    }
  }
  IVar38 = (pIVar31->IO).MousePos;
  (pIVar31->IO).MousePosPrev = IVar38;
  fVar37 = IVar38.x;
  for (lVar29 = 0; lVar29 != 5; lVar29 = lVar29 + 1) {
    bVar34 = (pIVar31->IO).MouseDown[lVar29];
    if ((bool)bVar34 == true) {
      fVar41 = (pIVar31->IO).MouseDownDuration[lVar29];
      pbVar28 = (pIVar31->IO).MouseClicked + lVar29;
      *pbVar28 = fVar41 < 0.0;
      pbVar28[10] = false;
      (pIVar31->IO).MouseDownDurationPrev[lVar29] = fVar41;
      if (0.0 <= fVar41) {
        (pIVar31->IO).MouseDownDuration[lVar29] = fVar41 + (pIVar31->IO).DeltaTime;
        (pIVar31->IO).MouseDoubleClicked[lVar29] = false;
        auVar49 = ZEXT816(0);
        if (-256000.0 <= fVar37 && -256000.0 <= fVar40) {
          IVar46 = (pIVar31->IO).MouseClickedPos[lVar29];
          auVar49._0_4_ = fVar37 - IVar46.x;
          auVar49._4_4_ = fVar40 - IVar46.y;
          auVar49._8_8_ = 0;
        }
        fVar41 = (pIVar31->IO).MouseDragMaxDistanceSqr[lVar29];
        fVar42 = auVar49._0_4_ * auVar49._0_4_ + auVar49._4_4_ * auVar49._4_4_;
        uVar35 = -(uint)(fVar42 <= fVar41);
        (pIVar31->IO).MouseDragMaxDistanceSqr[lVar29] =
             (float)(~uVar35 & (uint)fVar42 | (uint)fVar41 & uVar35);
        IVar46 = (pIVar31->IO).MouseDragMaxDistanceAbs[lVar29];
        fVar41 = IVar46.x;
        fVar42 = IVar46.y;
        auVar51._0_8_ = auVar49._0_8_ ^ 0x8000000080000000;
        auVar51._8_4_ = auVar49._8_4_ ^ 0x80000000;
        auVar51._12_4_ = auVar49._12_4_ ^ 0x80000000;
        auVar44 = maxps(auVar51,auVar49);
        uVar35 = -(uint)(auVar44._0_4_ <= fVar41);
        uVar36 = -(uint)(auVar44._4_4_ <= fVar42);
        (pIVar31->IO).MouseDragMaxDistanceAbs[lVar29] =
             (ImVec2)(CONCAT44(~uVar36 & (uint)auVar44._4_4_,~uVar35 & (uint)auVar44._0_4_) |
                     CONCAT44((uint)fVar42 & uVar36,(uint)fVar41 & uVar35));
      }
      else {
        (pIVar31->IO).MouseDownDuration[lVar29] = 0.0;
        (pIVar31->IO).MouseDoubleClicked[lVar29] = false;
        dVar6 = pIVar31->Time;
        fVar41 = (pIVar31->IO).MouseDoubleClickTime;
        if ((float)(dVar6 - (pIVar31->IO).MouseClickedTime[lVar29]) < fVar41) {
          fVar42 = 0.0;
          fVar50 = 0.0;
          if (-256000.0 <= fVar37 && -256000.0 <= fVar40) {
            IVar46 = (pIVar31->IO).MouseClickedPos[lVar29];
            fVar42 = fVar37 - IVar46.x;
            fVar50 = fVar40 - IVar46.y;
          }
          fVar5 = (pIVar31->IO).MouseDoubleClickMaxDist;
          if (fVar42 * fVar42 + fVar50 * fVar50 < fVar5 * fVar5) {
            (pIVar31->IO).MouseDoubleClicked[lVar29] = true;
          }
          dVar6 = (double)(fVar41 * -2.0);
        }
        (pIVar31->IO).MouseClickedTime[lVar29] = dVar6;
        (pIVar31->IO).MouseClickedPos[lVar29] = IVar38;
        (pIVar31->IO).MouseDownWasDoubleClick[lVar29] = (pIVar31->IO).MouseDoubleClicked[lVar29];
        pIVar3 = (pIVar31->IO).MouseDragMaxDistanceAbs + lVar29;
        pIVar3->x = 0.0;
        pIVar3->y = 0.0;
        (pIVar31->IO).MouseDragMaxDistanceSqr[lVar29] = 0.0;
        bVar34 = (pIVar31->IO).MouseDown[lVar29];
      }
    }
    else {
      (pIVar31->IO).MouseClicked[lVar29] = false;
      fVar41 = (pIVar31->IO).MouseDownDuration[lVar29];
      (pIVar31->IO).MouseReleased[lVar29] = 0.0 <= fVar41;
      pbVar28 = (pIVar31->IO).MouseClicked + lVar29;
      (pIVar31->IO).MouseDownDurationPrev[lVar29] = fVar41;
      (pIVar31->IO).MouseDownDuration[lVar29] = -1.0;
      (pIVar31->IO).MouseDoubleClicked[lVar29] = false;
    }
    if (((bVar34 & 1) == 0) && ((pIVar31->IO).MouseReleased[lVar29] == false)) {
      (pIVar31->IO).MouseDownWasDoubleClick[lVar29] = false;
    }
    if (*pbVar28 == true) {
      pIVar31->NavDisableMouseHover = false;
    }
  }
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar21 = GetTopMostPopupModal();
  if ((pIVar21 != (ImGuiWindow *)0x0) ||
     ((ctx->NavWindowingTarget != (ImGuiWindow *)0x0 && (0.0 < ctx->NavWindowingHighlightAlpha)))) {
    fVar37 = (ctx->IO).DeltaTime * 6.0 + ctx->DimBgRatio;
    if (1.0 <= fVar37) {
      fVar37 = 1.0;
    }
    ctx->DimBgRatio = fVar37;
  }
  else {
    fVar37 = (ctx->IO).DeltaTime * -10.0 + ctx->DimBgRatio;
    ctx->DimBgRatio = (float)(-(uint)(0.0 <= fVar37) & (uint)fVar37);
  }
  ctx->MouseCursor = 0;
  ctx->WantTextInputNextFrame = -1;
  ctx->WantCaptureMouseNextFrame = -1;
  ctx->WantCaptureKeyboardNextFrame = -1;
  (ctx->PlatformImePos).x = 1.0;
  pIVar31 = GImGui;
  (ctx->PlatformImePos).y = 1.0;
  pIVar21 = GImGui->WheelingWindow;
  if (pIVar21 == (ImGuiWindow *)0x0) {
LAB_0011e886:
    pIVar21 = (ImGuiWindow *)0x0;
  }
  else {
    fVar40 = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    GImGui->WheelingWindowTimer = fVar40;
    fVar37 = (pIVar31->IO).MousePos.x;
    if ((((-256000.0 <= fVar37) && (fVar41 = (pIVar31->IO).MousePos.y, -256000.0 <= fVar41)) &&
        (fVar37 = fVar37 - (pIVar31->WheelingWindowRefMousePos).x,
        fVar41 = fVar41 - (pIVar31->WheelingWindowRefMousePos).y,
        fVar42 = (pIVar31->IO).MouseDragThreshold,
        fVar42 * fVar42 < fVar37 * fVar37 + fVar41 * fVar41)) || (fVar40 <= 0.0)) {
      pIVar31->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar31->WheelingWindowTimer = 0.0;
      goto LAB_0011e886;
    }
  }
  fVar37 = (pIVar31->IO).MouseWheel;
  if (((((fVar37 != 0.0) || (fVar40 = (pIVar31->IO).MouseWheelH, fVar40 != 0.0)) || (NAN(fVar40)))
      && ((pIVar31->ActiveId == 0 || (pIVar31->ActiveIdUsingMouseWheel == false)))) &&
     (((pIVar31->HoveredIdPreviousFrame == 0 ||
       (pIVar31->HoveredIdPreviousFrameUsingMouseWheel == false)) &&
      (((pIVar21 != (ImGuiWindow *)0x0 ||
        (pIVar21 = pIVar31->HoveredWindow, pIVar21 != (ImGuiWindow *)0x0)) &&
       (pIVar21->Collapsed == false)))))) {
    if ((fVar37 != 0.0) || (NAN(fVar37))) {
      if ((pIVar31->IO).KeyCtrl == true) {
        if ((pIVar31->IO).FontAllowUserScaling == true) {
          StartLockWheelingWindow(pIVar21);
          fVar37 = pIVar21->FontWindowScale;
          fVar41 = (pIVar31->IO).MouseWheel * 0.1 + fVar37;
          fVar40 = 2.5;
          if (fVar41 <= 2.5) {
            fVar40 = fVar41;
          }
          fVar40 = (float)(-(uint)(fVar41 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar41 < 0.5) & (uint)fVar40);
          pIVar21->FontWindowScale = fVar40;
          if ((pIVar21->Flags & 0x1000000) == 0) {
            fVar40 = fVar40 / fVar37;
            fVar37 = (pIVar21->Pos).x;
            fVar41 = (pIVar21->Pos).y;
            IVar38 = pIVar21->Size;
            auVar45._8_8_ = 0;
            auVar45._0_4_ = IVar38.x;
            auVar45._4_4_ = IVar38.y;
            IVar46 = (pIVar31->IO).MousePos;
            auVar48._0_4_ = (IVar46.x - fVar37) * (1.0 - fVar40) * IVar38.x;
            auVar48._4_4_ = (IVar46.y - fVar41) * (1.0 - fVar40) * IVar38.y;
            auVar48._8_8_ = 0;
            auVar44 = divps(auVar48,auVar45);
            local_48.Min.x = auVar44._0_4_ + fVar37;
            local_48.Min.y = auVar44._4_4_ + fVar41;
            SetWindowPos(pIVar21,&local_48.Min,0);
            IVar39.x = (float)(int)((pIVar21->Size).x * fVar40);
            IVar39.y = (float)(int)((pIVar21->Size).y * fVar40);
            IVar10.y = (float)(int)((pIVar21->SizeFull).y * fVar40);
            IVar10.x = (float)(int)((pIVar21->SizeFull).x * fVar40);
            pIVar21->Size = IVar39;
            pIVar21->SizeFull = IVar10;
          }
          goto LAB_0011e8f3;
        }
      }
      else if ((pIVar31->IO).KeyShift == false) {
        StartLockWheelingWindow(pIVar21);
        while ((uVar35 = pIVar21->Flags, (uVar35 >> 0x18 & 1) != 0 &&
               (((uVar35 & 0x210) == 0x10 ||
                ((fVar40 = (pIVar21->ScrollMax).y, fVar40 == 0.0 && (!NAN(fVar40)))))))) {
          pIVar21 = pIVar21->ParentWindow;
        }
        if ((uVar35 & 0x210) == 0) {
          fVar41 = ((pIVar21->InnerRect).Max.y - (pIVar21->InnerRect).Min.y) * 0.67;
          fVar42 = ImGuiWindow::CalcFontSize(pIVar21);
          fVar40 = fVar42 * 5.0;
          if (fVar41 <= fVar42 * 5.0) {
            fVar40 = fVar41;
          }
          (pIVar21->ScrollTarget).y = (pIVar21->Scroll).y - fVar37 * (float)(int)fVar40;
          (pIVar21->ScrollTargetCenterRatio).y = 0.0;
          (pIVar21->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
    }
    fVar37 = (pIVar31->IO).MouseWheelH;
    if (((fVar37 == 0.0) && (!NAN(fVar37))) || ((pIVar31->IO).KeyShift == true)) {
      fVar37 = (pIVar31->IO).MouseWheel;
      if (((fVar37 == 0.0) && (!NAN(fVar37))) || ((pIVar31->IO).KeyShift != true))
      goto LAB_0011e8f3;
    }
    if ((pIVar31->IO).KeyCtrl == false) {
      StartLockWheelingWindow(pIVar21);
      while ((uVar35 = pIVar21->Flags, (uVar35 >> 0x18 & 1) != 0 &&
             (((uVar35 & 0x210) == 0x10 ||
              ((fVar40 = (pIVar21->ScrollMax).x, fVar40 == 0.0 && (!NAN(fVar40)))))))) {
        pIVar21 = pIVar21->ParentWindow;
      }
      if ((uVar35 & 0x210) == 0) {
        fVar41 = ((pIVar21->InnerRect).Max.x - (pIVar21->InnerRect).Min.x) * 0.67;
        fVar42 = ImGuiWindow::CalcFontSize(pIVar21);
        fVar40 = fVar42 + fVar42;
        if (fVar41 <= fVar42 + fVar42) {
          fVar40 = fVar41;
        }
        (pIVar21->ScrollTarget).x = (pIVar21->Scroll).x - fVar37 * (float)(int)fVar40;
        (pIVar21->ScrollTargetCenterRatio).x = 0.0;
        (pIVar21->ScrollTargetEdgeSnapDist).x = 0.0;
      }
    }
  }
LAB_0011e8f3:
  pIVar31 = GImGui;
  pIVar21 = GImGui->NavWindow;
  if ((((pIVar21 == (ImGuiWindow *)0x0) || (pIVar21->Active != true)) ||
      ((pIVar21->Flags & 0x40000) != 0)) || ((GImGui->IO).KeyCtrl != false)) {
    bVar13 = false;
  }
  else {
    bVar13 = IsKeyPressedMap(0,true);
  }
  pIVar31->FocusTabPressed = bVar13;
  if ((bVar13 == false) || (pIVar31->ActiveId != 0)) {
    pIVar21 = pIVar31->FocusRequestNextWindow;
  }
  else {
    pIVar21 = pIVar31->NavWindow;
    pIVar31->FocusRequestNextWindow = pIVar21;
    pIVar31->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar31->NavId == 0) || (pIVar31->NavIdTabCounter == 0x7fffffff)) {
      iVar20 = -(uint)(pIVar31->IO).KeyShift;
    }
    else {
      iVar20 = pIVar31->NavIdTabCounter + (-(uint)(pIVar31->IO).KeyShift | 1) + 1;
    }
    pIVar31->FocusRequestNextCounterTabStop = iVar20;
  }
  pIVar31->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar31->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar31->FocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar21 != (ImGuiWindow *)0x0) {
    pIVar31->FocusRequestCurrWindow = pIVar21;
    if ((pIVar31->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar20 = (pIVar21->DC).FocusCounterRegular, iVar20 != -1)) {
      pIVar31->FocusRequestCurrCounterRegular =
           (pIVar31->FocusRequestNextCounterRegular + iVar20 + 1) % (iVar20 + 1);
    }
    if ((pIVar31->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar20 = (pIVar21->DC).FocusCounterTabStop, iVar20 != -1)) {
      pIVar31->FocusRequestCurrCounterTabStop =
           (pIVar31->FocusRequestNextCounterTabStop + iVar20 + 1) % (iVar20 + 1);
    }
    pIVar31->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar31->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar31->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar31->NavIdTabCounter = 0x7fffffff;
  local_78 = 3.4028235e+38;
  if ((ctx->GcCompactAll == false) && (fVar37 = (ctx->IO).ConfigMemoryCompactTimer, 0.0 <= fVar37))
  {
    local_78 = (float)ctx->Time - fVar37;
  }
  for (uVar32 = 0; uVar32 != (uint)(ctx->Windows).Size; uVar32 = uVar32 + 1) {
    pIVar21 = (ctx->Windows).Data[uVar32];
    bVar13 = pIVar21->Active;
    pIVar21->WasActive = bVar13;
    pIVar21->BeginCount = 0;
    pIVar21->Active = false;
    pIVar21->WriteAccessed = false;
    if (((bVar13 == false) && (pIVar21->MemoryCompacted == false)) &&
       (pIVar21->LastTimeActive <= local_78 && local_78 != pIVar21->LastTimeActive)) {
      GcCompactTransientWindowBuffers(pIVar21);
    }
  }
  lVar29 = 0;
  for (lVar33 = 0; lVar33 < (ctx->TablesLastTimeActive).Size; lVar33 = lVar33 + 1) {
    fVar37 = (ctx->TablesLastTimeActive).Data[lVar33];
    if ((0.0 <= fVar37) && (fVar37 < local_78)) {
      TableGcCompactTransientBuffers((ImGuiTable *)((long)&((ctx->Tables).Buf.Data)->ID + lVar29));
    }
    lVar29 = lVar29 + 600;
  }
  if (ctx->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  ctx->GcCompactAll = false;
  if ((ctx->NavWindow != (ImGuiWindow *)0x0) && (ctx->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindow_*>::resize(&ctx->CurrentWindowStack,0);
  ImVector<ImGuiPopupData>::resize(&ctx->BeginPopupStack,0);
  ImVector<int>::resize(&ctx->ItemFlagsStack,0);
  local_48.Min = (ImVec2)((ulong)local_48.Min & 0xffffffff00000000);
  ImVector<int>::push_back(&ctx->ItemFlagsStack,(int *)&local_48);
  ImVector<ImGuiGroupData>::resize(&ctx->GroupStack,0);
  ClosePopupsOverWindow(ctx->NavWindow,false);
  pIVar31 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar31->DebugItemPickerActive == true) {
    uVar35 = pIVar31->HoveredIdPreviousFrame;
    pIVar31->MouseCursor = 7;
    bVar13 = IsKeyPressedMap(0xe,true);
    if (bVar13) {
      pIVar31->DebugItemPickerActive = false;
    }
    pIVar12 = GImGui;
    fVar37 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar37 != 0.0) || (NAN(fVar37))) {
      uVar36 = (uint)(uVar35 == 0);
    }
    else if (uVar35 == 0) {
      uVar36 = 1;
    }
    else {
      pIVar31->DebugItemPickerBreakId = uVar35;
      pIVar31->DebugItemPickerActive = false;
      uVar36 = 0;
    }
    pIVar2 = &pIVar12->NextWindowData;
    *(byte *)&pIVar2->Flags = (byte)pIVar2->Flags | 0x40;
    (pIVar12->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar35);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar36 << 4)),
                "Click to break in debugger!");
    End();
    pIVar31 = GImGui;
  }
  ctx->WithinFrameScopeWithImplicitWindow = true;
  *(byte *)&(pIVar31->NextWindowData).Flags = (byte)(pIVar31->NextWindowData).Flags | 2;
  (pIVar31->NextWindowData).SizeVal.x = 400.0;
  (pIVar31->NextWindowData).SizeVal.y = 400.0;
  (pIVar31->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  CallContextHooks(ctx,ImGuiContextHookType_NewFramePost);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;
    
    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_Default_);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}